

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::openDstFile(TSMuxer *this)

{
  FileFactory *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  File *this_00;
  ostream *poVar3;
  undefined4 *puVar4;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream ss;
  
  pFVar1 = (this->super_AbstractMuxer).m_fileFactory;
  if (pFVar1 == (FileFactory *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
  }
  else {
    iVar2 = (*pFVar1->_vptr_FileFactory[2])();
    this_00 = (File *)CONCAT44(extraout_var,iVar2);
  }
  this->m_muxFile = &this_00->super_AbstractOutputStream;
  iVar2 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                    (this_00,(this->m_outFileName)._M_dataplus._M_p,2,0);
  if ((char)iVar2 != '\0') {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Can\'t create file ");
  std::operator<<(poVar3,(string *)&this->m_outFileName);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 0x67;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1b0 == &local_1a0) {
    puVar4[6] = local_1a0;
    puVar4[7] = uStack_19c;
    puVar4[8] = uStack_198;
    puVar4[9] = uStack_194;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1b0;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_19c,local_1a0);
  }
  *(undefined8 *)(puVar4 + 4) = local_1a8;
  local_1a0 = local_1a0 & 0xffffff00;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::openDstFile()
{
    m_muxFile = m_fileFactory ? m_fileFactory->createFile() : new File();

    int systemFlags = 0;
#ifdef _WIN32
    if (m_owner->isAsyncMode())
        systemFlags += FILE_FLAG_NO_BUFFERING;
#endif
    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite, systemFlags))
        THROW(ERR_CANT_CREATE_FILE, "Can't create file " << m_outFileName)
}